

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall State::State(State *this,int w,int h,int *numbers)

{
  int iVar1;
  int j;
  int **ppiVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int i;
  long lVar6;
  
  this->width = w;
  this->height = h;
  this->size = h * w;
  this->previous = (State *)0x0;
  uVar5 = (ulong)(uint)h << 3;
  if (h < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppiVar2 = (int **)operator_new__(uVar5);
  this->tiles = ppiVar2;
  for (lVar6 = 0; lVar6 < h; lVar6 = lVar6 + 1) {
    uVar5 = (long)w * 4;
    if (w < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    piVar3 = (int *)operator_new__(uVar5);
    ppiVar2[lVar6] = piVar3;
    ppiVar2 = this->tiles;
    for (lVar4 = 0; lVar4 < w; lVar4 = lVar4 + 1) {
      iVar1 = numbers[w * (int)lVar6 + (int)lVar4];
      ppiVar2[lVar6][lVar4] = iVar1;
      if (iVar1 == 0) {
        (this->blank).height = (int)lVar6;
        (this->blank).width = (int)lVar4;
      }
      w = this->width;
    }
    h = this->height;
  }
  return;
}

Assistant:

State::State(int w, int h, int* numbers) {
    width = w;
    height = h;
    size = w * h;
    previous = nullptr;

    tiles = new int *[height];
    for (int i = 0; i < height; i++) {
        tiles[i] = new int[width];

        for (int j = 0; j < width; j++) {
            tiles[i][j] = numbers[i * width + j];

            if (tiles[i][j] == 0) {
                blank.height = i;
                blank.width = j;
            }
        }
    }
}